

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

int anon_unknown.dwarf_7b1da::GetNextNumber(string *in,int *val,size_type *pos,size_type *pos2)

{
  int *piVar1;
  int iVar2;
  size_type sVar3;
  char *pcVar4;
  string local_70 [32];
  string local_50 [32];
  size_type *local_30;
  size_type *pos2_local;
  size_type *pos_local;
  int *val_local;
  string *in_local;
  
  local_30 = pos2;
  pos2_local = pos;
  pos_local = (size_type *)val;
  val_local = (int *)in;
  sVar3 = std::__cxx11::string::find((char)in,0x2c);
  *local_30 = sVar3;
  if (*local_30 == 0xffffffffffffffff) {
    sVar3 = std::__cxx11::string::size();
    piVar1 = val_local;
    if (sVar3 == *pos2_local) {
      *(undefined4 *)pos_local = 0xffffffff;
    }
    else {
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_70,(ulong)piVar1);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      iVar2 = atoi(pcVar4);
      *(int *)pos_local = iVar2;
      std::__cxx11::string::~string(local_70);
    }
    in_local._4_4_ = 0;
  }
  else {
    if (*local_30 == *pos2_local) {
      *(undefined4 *)pos_local = 0xffffffff;
    }
    else {
      std::__cxx11::string::substr((ulong)local_50,(ulong)val_local);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      iVar2 = atoi(pcVar4);
      *(int *)pos_local = iVar2;
      std::__cxx11::string::~string(local_50);
    }
    *pos2_local = *local_30 + 1;
    in_local._4_4_ = 1;
  }
  return in_local._4_4_;
}

Assistant:

inline int GetNextNumber(std::string const& in, int& val,
                         std::string::size_type& pos,
                         std::string::size_type& pos2)
{
  pos2 = in.find(',', pos);
  if (pos2 != std::string::npos) {
    if (pos2 - pos == 0) {
      val = -1;
    } else {
      val = atoi(in.substr(pos, pos2 - pos).c_str());
    }
    pos = pos2 + 1;
    return 1;
  }
  if (in.size() - pos == 0) {
    val = -1;
  } else {
    val = atoi(in.substr(pos, in.size() - pos).c_str());
  }
  return 0;
}